

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

void print<mpt::reference<mpt::metatype>const>(void)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  long *plVar4;
  uint uVar5;
  uint uVar6;
  char local_3c [8];
  int local_34;
  
  uVar1 = mpt::type_properties<const_mpt::reference<mpt::metatype>_>::id(true);
  uVar2 = mpt::type_properties<mpt::span<const_mpt::reference<mpt::metatype>_>_>::id(true);
  local_34 = mpt::type_properties<mpt::span<const_mpt::reference<mpt::metatype>_>_>::id(true);
  uVar6 = 0;
  if ((uVar1 != 0) && (uVar6 = uVar1, 0xff < uVar1)) {
    if (uVar1 == 0x801) {
      uVar6 = 0x80;
    }
    else {
      uVar6 = 0xb;
      if (uVar1 != 0x802) {
        uVar6 = (uint)(uVar1 < 0x800) << 7;
      }
    }
  }
  uVar5 = 0;
  if ((uVar2 != 0) && (uVar5 = uVar2, 0xff < uVar2)) {
    if (uVar2 == 0x801) {
      uVar5 = 0x80;
    }
    else {
      uVar5 = 0xb;
      if (uVar2 != 0x802) {
        uVar5 = (uint)(uVar2 < 0x800) << 7;
      }
    }
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
  local_3c[0] = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c,1);
  local_3c[1] = 0x3c;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c + 1,1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,uVar6);
  local_3c[2] = 0x3e;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c + 2,1);
  local_3c[3] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c + 3,1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2);
  local_3c[4] = 0x20;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c + 4,1);
  local_3c[5] = 0x3c;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c + 5,1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,uVar5);
  local_3c[6] = 0x3e;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c + 6,1);
  local_3c[7] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c + 7,1);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_34);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return;
}

Assistant:

void print()
{
	int id = mpt::type_properties<T>::id(true);
	int sid = mpt::type_properties<mpt::span<const T> >::id(true);
	int mid = mpt::type_properties<mpt::span<T> >::id(true);
	int bid = mpt::basetype(id);
	int bsid = mpt::basetype(sid);
	std::cout << id  << ' ' << '<' << bid  << '>' << ' ';
	std::cout << sid << ' ' << '<' << bsid << '>' << ' ';
	std::cout << mid << std::endl;
}